

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::parseIntegerWidthOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  unkbyte9 Var1;
  char16_t cVar2;
  int32_t iVar3;
  uint index;
  uint index_00;
  int maxInt;
  int minInt;
  uint uVar4;
  IntegerWidth IVar5;
  anon_union_8_2_136a0349_for_fUnion local_40;
  undefined1 local_38;
  
  cVar2 = numparse::impl::StringSegment::charAt(segment,0);
  index_00 = (uint)(cVar2 == L'+');
  uVar4 = index_00;
  while ((iVar3 = numparse::impl::StringSegment::length(segment), (int)index_00 < iVar3 &&
         (cVar2 = numparse::impl::StringSegment::charAt(segment,index_00), cVar2 == L'#'))) {
    index_00 = index_00 + 1;
    uVar4 = uVar4 - 1;
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  minInt = 0;
  index = index_00;
  if ((int)index_00 < iVar3) {
    minInt = 0;
    while( true ) {
      index = index_00 + minInt;
      iVar3 = numparse::impl::StringSegment::length(segment);
      if ((iVar3 <= (int)index) ||
         (cVar2 = numparse::impl::StringSegment::charAt(segment,index), cVar2 != L'0')) break;
      minInt = minInt + 1;
    }
  }
  maxInt = -1;
  if (uVar4 != 1) {
    maxInt = minInt - uVar4;
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  if ((int)index < iVar3) {
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else {
    if (maxInt == -1) {
      IVar5 = IntegerWidth::zeroFillTo(minInt);
      Var1 = IVar5._0_9_;
    }
    else {
      IVar5 = IntegerWidth::zeroFillTo(minInt);
      local_40 = IVar5.fUnion;
      local_38 = IVar5.fHasError;
      IVar5 = IntegerWidth::truncateAt((IntegerWidth *)&local_40.minMaxInt,maxInt);
      Var1 = IVar5._0_9_;
    }
    (macros->integerWidth).fUnion = SUB98(Var1,0);
    (macros->integerWidth).fHasError = SUB91((unkuint9)Var1 >> 0x40,0);
  }
  return;
}

Assistant:

void blueprint_helpers::parseIntegerWidthOption(const StringSegment& segment, MacroProps& macros,
                                                UErrorCode& status) {
    int32_t offset = 0;
    int32_t minInt = 0;
    int32_t maxInt;
    if (segment.charAt(0) == u'+') {
        maxInt = -1;
        offset++;
    } else {
        maxInt = 0;
    }
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'#') {
            maxInt++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        for (; offset < segment.length(); offset++) {
            if (segment.charAt(offset) == u'0') {
                minInt++;
            } else {
                break;
            }
        }
    }
    if (maxInt != -1) {
        maxInt += minInt;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid integer width stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxInt == -1) {
        macros.integerWidth = IntegerWidth::zeroFillTo(minInt);
    } else {
        macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
    }
}